

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

int __thiscall TPZCheckMesh::VerifyConnect(TPZCheckMesh *this,int connect)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  int64_t iVar5;
  void *pvVar6;
  int *piVar7;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  TPZCompMesh *mesh;
  TPZConnect *out;
  TPZCompEl *pTVar8;
  int in_ESI;
  undefined8 *in_RDI;
  int icl;
  int ncl;
  TPZCompEl *cel;
  TPZConnect *c_1;
  TPZCompElSide large_1;
  TPZCompElSide smalll;
  int id;
  int ndep;
  TPZStack<int,_10> deplist;
  TPZCompElSide large;
  TPZConnect *c;
  TPZCompElSide elcon;
  int check;
  TPZStack<int,_10> *in_stack_fffffffffffffe50;
  long in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  TPZVec<int> *in_stack_fffffffffffffe78;
  TPZCompEl *in_stack_fffffffffffffe80;
  TPZCompElSide *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe94;
  TPZCheckMesh *in_stack_fffffffffffffe98;
  int local_d0;
  TPZCompElSide local_b8;
  TPZCompElSide local_a8;
  int local_94;
  int local_90;
  TPZVec<int> local_80 [2];
  TPZCompElSide local_38;
  TPZConnect *local_28;
  int local_10;
  int local_c;
  
  local_10 = 1;
  local_c = in_ESI;
  FindElement(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
  TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
  local_28 = TPZChunkVector<TPZConnect,_10>::operator[]
                       ((TPZChunkVector<TPZConnect,_10> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58);
  TPZCompElSide::LowerLevelElementList
            (in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  iVar2 = TPZConnect::HasDependency(local_28);
  if ((iVar2 != 0) && (bVar1 = TPZCompElSide::operator_cast_to_bool(&local_38), !bVar1)) {
    poVar4 = std::operator<<((ostream *)in_RDI[1],"Connect ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
    std::operator<<(poVar4," has dependency but no large element\n");
    local_10 = 0;
  }
  uVar3 = TPZConnect::NShape(local_28);
  if (((uVar3 != 0) && (iVar2 = TPZConnect::HasDependency(local_28), iVar2 == 0)) &&
     (bVar1 = TPZCompElSide::operator_cast_to_bool(&local_38), bVar1)) {
    poVar4 = std::operator<<((ostream *)in_RDI[1],"Connect ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
    std::operator<<(poVar4," has no dependency but has large element\n");
    local_10 = 0;
  }
  TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffe50);
  BuildDependList((TPZCheckMesh *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                  (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50);
  iVar5 = TPZVec<int>::NElements(local_80);
  local_90 = (int)iVar5;
  for (local_94 = 0; iVar2 = local_10, local_94 < local_90; local_94 = local_94 + 1) {
    TPZVec<int>::operator[](local_80,(long)local_94);
    FindElement(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
    TPZCompElSide::LowerLevelElementList
              (in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    iVar2 = TPZCompElSide::Exists(&local_b8);
    if (iVar2 == 0) {
      local_10 = 0;
      poVar4 = std::operator<<((ostream *)in_RDI[1],"VerifyConnect of connect ");
      pvVar6 = (void *)std::ostream::operator<<(poVar4,local_c);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)in_RDI[1],"deplist = ");
      poVar4 = ::operator<<((ostream *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      poVar4 = std::operator<<(poVar4," deplist[id] = ");
      piVar7 = TPZVec<int>::operator[](local_80,(long)local_94);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,*piVar7);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)in_RDI[1],
                               "Connect index of connect which is restrained deplist[id] = ");
      piVar7 = TPZVec<int>::operator[](local_80,(long)local_94);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,*piVar7);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      this_00 = TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
      mesh = (TPZCompMesh *)TPZVec<int>::operator[](local_80,(long)local_94);
      out = TPZChunkVector<TPZConnect,_10>::operator[]
                      ((TPZChunkVector<TPZConnect,_10> *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58);
      TPZConnect::Print((TPZConnect *)this_00,mesh,(ostream *)out);
      in_stack_fffffffffffffe98 =
           (TPZCheckMesh *)
           std::operator<<((ostream *)in_RDI[1],"Element/side which contains deplist[id] side = ");
      in_stack_fffffffffffffe94 = TPZCompElSide::Side(&local_a8);
      in_stack_fffffffffffffe88 =
           (TPZCompElSide *)
           std::ostream::operator<<(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
      std::operator<<((ostream *)in_stack_fffffffffffffe88,"\n");
      in_stack_fffffffffffffe80 = TPZCompElSide::Element(&local_a8);
      (**(code **)(*(long *)in_stack_fffffffffffffe80 + 200))(in_stack_fffffffffffffe80,in_RDI[1]);
      in_stack_fffffffffffffe78 =
           (TPZVec<int> *)std::operator<<((ostream *)in_RDI[1],"VerifyConnect of ");
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe78,local_c);
      std::operator<<(poVar4," inconsistent\n");
    }
    else {
      pTVar8 = TPZCompElSide::Element(&local_b8);
      iVar2 = (**(code **)(*(long *)pTVar8 + 0x90))();
      local_d0 = 0;
      in_stack_fffffffffffffe64 = iVar2;
      while ((local_d0 < iVar2 &&
             (in_stack_fffffffffffffe58 = (**(code **)(*(long *)pTVar8 + 0xa0))(pTVar8,local_d0),
             in_stack_fffffffffffffe58 != local_c))) {
        local_d0 = local_d0 + 1;
      }
      if (local_d0 == iVar2) {
        local_10 = 0;
        poVar4 = std::operator<<((ostream *)in_RDI[1],"VerifyConnect of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
        std::operator<<(poVar4," inconsistent\n");
      }
    }
  }
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x19f01f7);
  return iVar2;
}

Assistant:

int TPZCheckMesh::VerifyConnect(int connect) {

    int check = 1;

    {
        TPZCompElSide elcon = FindElement(connect);
        TPZConnect &c = fMesh->ConnectVec()[connect];
        TPZCompElSide large = elcon.LowerLevelElementList(1);
        if (c.HasDependency() && !large) {
            *fOut << "Connect " << connect << " has dependency but no large element\n";
            check = 0;
        }
        if(c.NShape() && !c.HasDependency() && large)
        {
            *fOut << "Connect " << connect << " has no dependency but has large element\n";
            check = 0;
        }
    }
	TPZStack<int> deplist;
	BuildDependList(connect,deplist);
	int ndep = deplist.NElements();
	int id;
	for(id=0; id<ndep; id++) {
		TPZCompElSide smalll = FindElement(deplist[id]);
		TPZCompElSide large = smalll.LowerLevelElementList(1);
		if(!large.Exists()) {
			check = 0;
            (*fOut) << "VerifyConnect of connect " << connect << std::endl;
            (*fOut) << "deplist = " << deplist << " deplist[id] = " << deplist[id] << std::endl;
            (*fOut) << "Connect index of connect which is restrained deplist[id] = " << deplist[id] << std::endl;
            TPZConnect &c = fMesh->ConnectVec()[deplist[id]];
            c.Print(*fMesh,(*fOut));
            (*fOut) << "Element/side which contains deplist[id] side = " << smalll.Side() << "\n";
            smalll.Element()->Print(*fOut);
			(*fOut) << "VerifyConnect of " << connect << " inconsistent\n";
			continue;
		}
		TPZCompEl *cel = large.Element();
		int ncl = cel->NConnects();
		int icl;
		for(icl=0; icl<ncl; icl++) {
			if(cel->ConnectIndex(icl) == connect) break;
		}
		if(icl == ncl) {
			check = 0;
			(*fOut) << "VerifyConnect of " << connect << " inconsistent\n";
		}
	}
	return check;
}